

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O0

StringVector * Imf_3_3::anon_unknown_5::parseString(string *name,char c)

{
  long lVar1;
  char *pcVar2;
  char in_DL;
  string *in_RSI;
  StringVector *in_RDI;
  bool bVar3;
  string sec;
  size_t s;
  StringVector *r;
  value_type *in_stack_ffffffffffffff48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  string local_70 [48];
  value_type local_40;
  long local_20;
  undefined1 local_12;
  char local_11;
  
  local_12 = 0;
  local_11 = in_DL;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1486ef);
  while (lVar1 = std::__cxx11::string::size(), lVar1 != 0) {
    local_20 = std::__cxx11::string::find((char)in_RSI,(ulong)(uint)(int)local_11);
    std::__cxx11::string::substr((ulong)&local_40,(ulong)in_RSI);
    while( true ) {
      lVar1 = std::__cxx11::string::size();
      bVar3 = false;
      if (lVar1 != 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&local_40);
        bVar3 = *pcVar2 == ' ';
      }
      if (!bVar3) break;
      std::__cxx11::string::erase((ulong)&local_40,0);
    }
    while( true ) {
      lVar1 = std::__cxx11::string::size();
      bVar3 = false;
      if (lVar1 != 0) {
        in_stack_ffffffffffffff48 = &local_40;
        std::__cxx11::string::size();
        in_stack_ffffffffffffff50 =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::__cxx11::string::operator[]((ulong)in_stack_ffffffffffffff48);
        bVar3 = *(char *)&(in_stack_ffffffffffffff50->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start == ' ';
      }
      if (!bVar3) break;
      lVar1 = std::__cxx11::string::size();
      std::__cxx11::string::erase((ulong)&local_40,lVar1 - 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (local_20 == -1) {
      std::__cxx11::string::operator=(in_RSI,"");
    }
    else {
      std::__cxx11::string::substr((ulong)local_70,(ulong)in_RSI);
      std::__cxx11::string::operator=(in_RSI,local_70);
      std::__cxx11::string::~string(local_70);
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return in_RDI;
}

Assistant:

StringVector
parseString (string name, char c = '.')
{
    //
    // Turn name into a list of strings, separating
    // on char 'c' with whitespace stripped.
    //

    StringVector r;

    while (name.size () > 0)
    {
        size_t s   = name.find (c);
        string sec = name.substr (0, s);

        //
        // Strip spaces from beginning
        //

        while (sec.size () > 0 && sec[0] == ' ')
            sec.erase (0, 1);

        //
        // Strip spaces from end
        //

        while (sec.size () > 0 && sec[sec.size () - 1] == ' ')
            sec.erase (sec.size () - 1);

        r.push_back (sec);

        //
        // Strip off name including ending 'c'
        //

        if (s == name.npos)
            name = "";
        else
            name = name.substr (s + 1);
    }

    return r;
}